

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  optional<google::protobuf::io::AnnotationCollector::Semantic> oVar1;
  bool bVar2;
  MessageLite *this_00;
  size_type sVar3;
  const_reference pvVar4;
  uint32_t *puVar5;
  Semantic *pSVar6;
  int local_5c;
  int i;
  GeneratedCodeInfo_Annotation *annotation;
  vector<int,_std::allocator<int>_> *path_local;
  string *file_path_local;
  size_t end_offset_local;
  size_t begin_offset_local;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this_local;
  optional<google::protobuf::io::AnnotationCollector::Semantic> semantic_local;
  
  this_local = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
               semantic.
               super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
               ._M_payload.
               super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  this_00 = (MessageLite *)GeneratedCodeInfo::add_annotation(this->annotation_proto_);
  for (local_5c = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(path),
      (ulong)(long)local_5c < sVar3; local_5c = local_5c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](path,(long)local_5c);
    GeneratedCodeInfo_Annotation::add_path((GeneratedCodeInfo_Annotation *)this_00,*pvVar4);
  }
  semantic_local.
  super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> =
       (_Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>)
       (_Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>)file_path;
  puVar5 = internal::HasBits<1>::operator[]((HasBits<1> *)(this_00 + 1),0);
  oVar1.super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> =
       semantic_local.
       super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  *puVar5 = *puVar5 | 1;
  MessageLite::GetArena(this_00);
  google::protobuf::internal::ArenaStringPtr::Set<>
            ((string *)(this_00 + 3),
             (Arena *)oVar1.
                      super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
            );
  GeneratedCodeInfo_Annotation::set_begin
            ((GeneratedCodeInfo_Annotation *)this_00,(int32_t)begin_offset);
  GeneratedCodeInfo_Annotation::set_end((GeneratedCodeInfo_Annotation *)this_00,(int32_t)end_offset)
  ;
  bVar2 = std::optional<google::protobuf::io::AnnotationCollector::Semantic>::has_value
                    ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&this_local);
  if (bVar2) {
    pSVar6 = std::optional<google::protobuf::io::AnnotationCollector::Semantic>::operator*
                       ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&this_local
                       );
    SetSemantic<google::protobuf::GeneratedCodeInfo_Annotation>(this_00,*pSVar6);
  }
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path, const std::vector<int>& path,
                     absl::optional<Semantic> semantic) override {
    auto* annotation = annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);

    if (semantic.has_value()) {
      SetSemantic(annotation, *semantic, Rank1{});
    }
  }